

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::CachedTxGetAvailableCredit(CWallet *wallet,CWalletTx *wtx,isminefilter *filter)

{
  bool bVar1;
  byte bVar2;
  Txid *pTVar3;
  isminefilter *filter_00;
  isminefilter *piVar4;
  CAmount CVar5;
  runtime_error *this;
  uint *in_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  CTxOut *txout;
  uint i;
  bool allow_used_addresses;
  bool allow_cache;
  CAmount nCredit;
  Txid hashTx;
  undefined4 in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffecc;
  CWalletTx *in_stack_fffffffffffffed0;
  CWallet *in_stack_fffffffffffffed8;
  COutPoint *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeef;
  byte local_101;
  undefined7 in_stack_ffffffffffffff08;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff13;
  undefined1 uVar11;
  undefined4 in_stack_ffffffffffffff14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  uint local_d8;
  CScript *local_b8;
  CWallet *in_stack_ffffffffffffff60;
  string local_70 [72];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffecc,(AnnotatedMixin<std::recursive_mutex> *)0x9c0eef);
  bVar9 = false;
  if ((*in_RDX & 3) != 0) {
    bVar9 = (*in_RDX & 3) != 3;
  }
  uVar10 = bVar9;
  bVar1 = CWallet::IsTxImmatureCoinBase(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  if (bVar1) {
    local_b8 = (CScript *)0x0;
  }
  else {
    bVar7 = 0;
    bVar8 = bVar7;
    if (bVar9 != false) {
      std::bitset<8UL>::operator[]
                ((bitset<8UL> *)in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar7 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffed8);
      bVar8 = bVar7;
      std::bitset<8UL>::reference::~reference
                ((reference *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    if ((bVar7 & 1) == 0) {
      bVar6 = 1;
      if ((*in_RDX & 4) == 0) {
        bVar1 = CWallet::IsWalletFlagSet
                          (in_stack_fffffffffffffed8,(uint64_t)in_stack_fffffffffffffed0);
        bVar6 = bVar1 ^ 0xff;
      }
      bVar2 = bVar6 & 1;
      local_b8 = (CScript *)0x0;
      pTVar3 = CWalletTx::GetHash((CWalletTx *)
                                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_28 = *(undefined8 *)(pTVar3->m_wrapped).super_base_blob<256U>.m_data._M_elems;
      local_20 = *(undefined8 *)((pTVar3->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
      local_18 = *(undefined8 *)((pTVar3->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_10 = *(undefined8 *)((pTVar3->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_d8 = 0;
      while( true ) {
        filter_00 = (isminefilter *)(ulong)local_d8;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        piVar4 = (isminefilter *)
                 std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                           ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (piVar4 <= filter_00) break;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffed8,
                   (size_type)in_stack_fffffffffffffed0);
        COutPoint::COutPoint
                  ((COutPoint *)in_stack_fffffffffffffed8,(Txid *)in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffecc);
        bVar1 = CWallet::IsSpent((CWallet *)
                                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                                 in_stack_fffffffffffffee0);
        local_101 = 0;
        if ((!bVar1) &&
           (in_stack_fffffffffffffeef = 1, local_101 = in_stack_fffffffffffffeef, bVar2 == 0)) {
          bVar1 = CWallet::IsSpentKey(in_stack_ffffffffffffff60,local_b8);
          in_stack_fffffffffffffeef = bVar1 ^ 0xff;
          local_101 = in_stack_fffffffffffffeef;
        }
        if ((local_101 & 1) != 0) {
          CVar5 = OutputGetCredit((CWallet *)
                                  CONCAT44(in_stack_ffffffffffffff14,
                                           CONCAT13(in_stack_ffffffffffffff13,
                                                    CONCAT12(uVar10,CONCAT11(bVar8,bVar7)))),
                                  (CTxOut *)CONCAT17(bVar6,in_stack_ffffffffffffff08),filter_00);
          local_b8 = (CScript *)((long)&(local_b8->super_CScriptBase)._union + CVar5);
          bVar1 = MoneyRange((CAmount *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          if (!bVar1) {
            uVar11 = 1;
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xffffffffffffff57;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(uVar11,CONCAT12(uVar10,CONCAT11(bVar8,bVar7)))),
                       (allocator<char> *)CONCAT17(bVar6,in_stack_ffffffffffffff08));
            std::operator+(__lhs,(char *)this);
            std::runtime_error::runtime_error(this,local_70);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_009c1352;
          }
        }
        local_d8 = local_d8 + 1;
      }
      if (bVar9 != false) {
        CachableAmount::Set((CachableAmount *)in_stack_fffffffffffffed8,
                            (isminefilter)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        *(undefined1 *)(in_RSI + 0x188) = 0;
      }
    }
    else {
      local_b8 = *(CScript **)(in_RSI + 0x148 + (ulong)*in_RDX * 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (CAmount)local_b8;
  }
LAB_009c1352:
  __stack_chk_fail();
}

Assistant:

CAmount CachedTxGetAvailableCredit(const CWallet& wallet, const CWalletTx& wtx, const isminefilter& filter)
{
    AssertLockHeld(wallet.cs_wallet);

    // Avoid caching ismine for NO or ALL cases (could remove this check and simplify in the future).
    bool allow_cache = (filter & ISMINE_ALL) && (filter & ISMINE_ALL) != ISMINE_ALL;

    // Must wait until coinbase is safely deep enough in the chain before valuing it
    if (wallet.IsTxImmatureCoinBase(wtx))
        return 0;

    if (allow_cache && wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].m_cached[filter]) {
        return wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].m_value[filter];
    }

    bool allow_used_addresses = (filter & ISMINE_USED) || !wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE);
    CAmount nCredit = 0;
    Txid hashTx = wtx.GetHash();
    for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
        const CTxOut& txout = wtx.tx->vout[i];
        if (!wallet.IsSpent(COutPoint(hashTx, i)) && (allow_used_addresses || !wallet.IsSpentKey(txout.scriptPubKey))) {
            nCredit += OutputGetCredit(wallet, txout, filter);
            if (!MoneyRange(nCredit))
                throw std::runtime_error(std::string(__func__) + " : value out of range");
        }
    }

    if (allow_cache) {
        wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].Set(filter, nCredit);
        wtx.m_is_cache_empty = false;
    }

    return nCredit;
}